

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O2

void oonf_packet_remove_managed(oonf_packet_managed *managed,_Bool forced)

{
  oonf_packet_remove(&managed->socket_v4,false);
  oonf_packet_remove(&managed->socket_v6,false);
  oonf_packet_remove(&managed->multicast_v4,false);
  oonf_packet_remove(&managed->multicast_v6,false);
  os_interface_linux_remove(&managed->_if_listener);
  oonf_packet_free_managed_config(&managed->_managed_config);
  return;
}

Assistant:

void
oonf_packet_remove_managed(struct oonf_packet_managed *managed, bool forced) {
  oonf_packet_remove(&managed->socket_v4, forced);
  oonf_packet_remove(&managed->socket_v6, forced);
  oonf_packet_remove(&managed->multicast_v4, forced);
  oonf_packet_remove(&managed->multicast_v6, forced);

  os_interface_remove(&managed->_if_listener);
  oonf_packet_free_managed_config(&managed->_managed_config);
}